

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlElementType xVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr value;
  int error;
  undefined4 in_register_00000034;
  _xmlNode *val;
  xmlXPathContextPtr ctxt_00;
  
  val = (_xmlNode *)CONCAT44(in_register_00000034,nargs);
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 0) {
    pxVar4 = xmlXPathCacheNewNodeSet(ctxt->context,ctxt->context->node);
    valuePush(ctxt,pxVar4);
    val = (_xmlNode *)&DAT_00000001;
  }
  if ((int)val != 1) {
    error = 0xc;
LAB_001de743:
    xmlXPathErr(ctxt,error);
    return;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    error = 0x17;
    goto LAB_001de743;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((ctxt->value->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
    error = 0xb;
    goto LAB_001de743;
  }
  pxVar4 = valuePop(ctxt);
  pxVar2 = pxVar4->nodesetval;
  if ((pxVar2 == (xmlNodeSetPtr)0x0) || (pxVar2->nodeNr == 0)) {
LAB_001de74f:
    ctxt_00 = ctxt->context;
LAB_001de753:
    value = xmlXPathCacheNewCString(ctxt_00,(char *)val);
  }
  else {
    pxVar3 = *pxVar2->nodeTab;
    xVar1 = pxVar3->type;
    if (xVar1 - XML_ELEMENT_NODE < 2) {
LAB_001de710:
      val = (_xmlNode *)pxVar3->name;
      ctxt_00 = ctxt->context;
      if (*(xmlChar *)&val->_private == ' ') goto LAB_001de753;
    }
    else {
      if (xVar1 != XML_NAMESPACE_DECL) {
        if (xVar1 != XML_PI_NODE) goto LAB_001de74f;
        goto LAB_001de710;
      }
      ctxt_00 = ctxt->context;
      val = pxVar3->children;
    }
    value = xmlXPathCacheNewString(ctxt_00,(xmlChar *)val);
  }
  valuePush(ctxt,value);
  xmlXPathReleaseObject(ctxt->context,pxVar4);
  return;
}

Assistant:

void
xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;

    if (nargs == 0) {
	valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
	    ctxt->context->node));
	nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = valuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
	valuePush(ctxt, xmlXPathCacheNewCString(ctxt->context, ""));
    } else {
	int i = 0; /* Should be first in document order !!!!! */
	switch (cur->nodesetval->nodeTab[i]->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	case XML_PI_NODE:
	    if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		valuePush(ctxt, xmlXPathCacheNewCString(ctxt->context, ""));
	    else
		valuePush(ctxt,
		      xmlXPathCacheNewString(ctxt->context,
			cur->nodesetval->nodeTab[i]->name));
	    break;
	case XML_NAMESPACE_DECL:
	    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
			((xmlNsPtr)cur->nodesetval->nodeTab[i])->prefix));
	    break;
	default:
	    valuePush(ctxt, xmlXPathCacheNewCString(ctxt->context, ""));
	}
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}